

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O0

void __thiscall lora_merge_ctx::copy_tensor(lora_merge_ctx *this,ggml_tensor *base)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  undefined8 uVar2;
  uchar *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  string *in_RDI;
  file_input *unaff_retaddr;
  size_t len;
  pointer *n;
  ofstream *file;
  allocator<char> *in_stack_ffffffffffffff90;
  ggml_tensor *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_30 [32];
  string *name;
  
  pvVar1 = in_RSI + 10;
  name = in_RDI;
  ggml_ne_string_abi_cxx11_(in_stack_ffffffffffffff98);
  uVar2 = std::__cxx11::string::c_str();
  printf("%s :  %s [%s]\n","copy_tensor",
         &(pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage,uVar2);
  std::__cxx11::string::~string(local_30);
  ggml_nbytes(in_RSI);
  n = &in_RSI[10].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  file = (ofstream *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  file_input::read_tensor_data(unaff_retaddr,name,in_RSI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x183b82);
  std::ostream::write((char *)&in_RDI[0x15]._M_string_length,(long)puVar3);
  zeros(file,(size_t)n);
  return;
}

Assistant:

void copy_tensor(struct ggml_tensor * base) {
        printf("%s :  %s [%s]\n", __func__, base->name, ggml_ne_string(base).c_str());
        size_t len = ggml_nbytes(base);
        base_model.read_tensor_data(base->name, read_buf);
        fout.write((char* )read_buf.data(), len);
        zeros(fout, GGML_PAD(len, GGUF_DEFAULT_ALIGNMENT) - len);
    }